

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathDebugDumpNode(FILE *output,xmlNodePtr cur,int depth)

{
  xmlElementType xVar1;
  uint uVar2;
  size_t __size;
  char *__ptr;
  ulong __n;
  char shift [100];
  char local_88 [104];
  
  if (depth < 1) {
    __n = 0;
  }
  else {
    uVar2 = 0x18;
    if (depth - 1U < 0x18) {
      uVar2 = depth - 1U;
    }
    __n = (ulong)(uVar2 * 2 + 2);
    memset(local_88,0x20,__n);
  }
  (local_88 + __n)[0] = '\0';
  (local_88 + __n)[1] = '\0';
  if (cur == (xmlNodePtr)0x0) {
    fputs(local_88,(FILE *)output);
    __ptr = "Node is NULL !\n";
    __size = 0xf;
  }
  else {
    xVar1 = cur->type;
    if (xVar1 == XML_ATTRIBUTE_NODE) {
      xmlDebugDumpAttr(output,(xmlAttrPtr)cur,depth);
      return;
    }
    if ((xVar1 != XML_HTML_DOCUMENT_NODE) && (xVar1 != XML_DOCUMENT_NODE)) {
      xmlDebugDumpOneNode(output,cur,depth);
      return;
    }
    fputs(local_88,(FILE *)output);
    __ptr = " /\n";
    __size = 3;
  }
  fwrite(__ptr,__size,1,(FILE *)output);
  return;
}

Assistant:

static void
xmlXPathDebugDumpNode(FILE *output, xmlNodePtr cur, int depth) {
    int i;
    char shift[100];

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;
    if (cur == NULL) {
	fprintf(output, "%s", shift);
	fprintf(output, "Node is NULL !\n");
	return;

    }

    if ((cur->type == XML_DOCUMENT_NODE) ||
	     (cur->type == XML_HTML_DOCUMENT_NODE)) {
	fprintf(output, "%s", shift);
	fprintf(output, " /\n");
    } else if (cur->type == XML_ATTRIBUTE_NODE)
	xmlDebugDumpAttr(output, (xmlAttrPtr)cur, depth);
    else
	xmlDebugDumpOneNode(output, cur, depth);
}